

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jit.c
# Opt level: O0

int ravi_compile_n(lua_State *L)

{
  int iVar1;
  void *pvVar2;
  int local_374;
  int iStack_370;
  int result;
  lua_Integer ival;
  ravi_compile_options_t options;
  LClosure *l_1;
  void *p_1;
  LClosure *l;
  void *p;
  Proto *local_338;
  int n;
  Proto *functions [100];
  lua_State *L_local;
  
  p._4_4_ = 0;
  iVar1 = lua_type(L,1);
  if (iVar1 == 5) {
    lua_pushnil(L);
    while( true ) {
      iVar1 = lua_next(L,1);
      if (iVar1 == 0) break;
      if ((((p._4_4_ < 100) && (iVar1 = lua_type(L,-1), iVar1 == 6)) &&
          (iVar1 = lua_iscfunction(L,-1), iVar1 == 0)) &&
         (pvVar2 = lua_topointer(L,-1), *(long *)(*(long *)((long)pvVar2 + 0x18) + 0x88) == 0)) {
        functions[(long)p._4_4_ + -1] = *(Proto **)((long)pvVar2 + 0x18);
        p._4_4_ = p._4_4_ + 1;
      }
      lua_settop(L,-2);
    }
  }
  else {
    iVar1 = lua_type(L,1);
    if ((iVar1 != 6) || (iVar1 = lua_iscfunction(L,1), iVar1 != 0)) {
      luaL_argerror(L,1,"argument must be a Lua function");
    }
    options = (ravi_compile_options_t)lua_topointer(L,1);
    local_338 = *(Proto **)((long)options + 0x18);
    p._4_4_ = 1;
  }
  memset(&ival,0,8);
  ival._0_1_ = (byte)ival & 0xf8 | 7;
  iVar1 = lua_type(L,2);
  if (iVar1 == 5) {
    l_table_get_integer(L,2,"omitArrayGetRangeCheck",(lua_Integer *)&iStack_370,0);
    ival._0_1_ = (byte)ival & 0xfd | (iStack_370 != 0) << 1;
    l_table_get_integer(L,2,"inlineLuaArithmeticOperators",(lua_Integer *)&iStack_370,0);
    ival._0_1_ = (byte)ival & 0xfb | (iStack_370 != 0) << 2;
  }
  local_374 = 0;
  if (0 < p._4_4_) {
    local_374 = raviV_compile_n(L,&stack0xfffffffffffffcc8,p._4_4_,(ravi_compile_options_t *)&ival);
  }
  lua_pushboolean(L,local_374);
  return 1;
}

Assistant:

static int ravi_compile_n(lua_State *L) {
  enum { MAX_COMPILES = 100 };
  Proto *functions[MAX_COMPILES];
  int n = 0;
  if (lua_istable(L, 1)) {
    lua_pushnil(L);  // push first key
    while (lua_next(L, 1)) {
      if (n < MAX_COMPILES && lua_isfunction(L, -1) &&
          !lua_iscfunction(L, -1)) {
        void *p = (void *)lua_topointer(L, -1);
        LClosure *l = (LClosure *)(p);
        if (!l->p->ravi_jit.jit_function) functions[n++] = l->p;
      }
      lua_pop(L, 1);  // pop value, but keep key
    }
  }
  else {
    luaL_argcheck(L, lua_isfunction(L, 1) && !lua_iscfunction(L, 1), 1,
                  "argument must be a Lua function");
    void *p = (void *)lua_topointer(L, 1);
    LClosure *l = (LClosure *)(p);
    functions[n++] = l->p;
  }
  ravi_compile_options_t options = {0, 0, 0, RAVI_CODEGEN_NONE};
  options.manual_request = 1;
  options.inline_lua_arithmetic_operators = 1;
  options.omit_array_get_range_check = 1;
  if (lua_istable(L, 2)) {
    lua_Integer ival;
    l_table_get_integer(L, 2, "omitArrayGetRangeCheck",
                        &ival, 0);
    options.omit_array_get_range_check = (int)ival ? 1 : 0;
    l_table_get_integer(L, 2, "inlineLuaArithmeticOperators",
                        &ival, 0);
    options.inline_lua_arithmetic_operators = (int)ival ? 1 : 0;
  }
  int result = 0;
  if (n > 0) { result = raviV_compile_n(L, functions, n, &options); }
  lua_pushboolean(L, result);
  return 1;
}